

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlCheckFilename(char *path)

{
  int iVar1;
  undefined1 local_a8 [8];
  stat stat_buffer;
  char *path_local;
  
  if (path == (char *)0x0) {
    path_local._4_4_ = 0;
  }
  else {
    stat_buffer.__glibc_reserved[2] = (__syscall_slong_t)path;
    iVar1 = stat64(path,(stat64 *)local_a8);
    if (iVar1 == -1) {
      path_local._4_4_ = 0;
    }
    else if (((uint)stat_buffer.st_nlink & 0xf000) == 0x4000) {
      path_local._4_4_ = 2;
    }
    else {
      path_local._4_4_ = 1;
    }
  }
  return path_local._4_4_;
}

Assistant:

int
xmlCheckFilename (const char *path)
{
#ifdef HAVE_STAT
#if defined(_WIN32)
    struct _stat stat_buffer;
#else
    struct stat stat_buffer;
#endif
#endif
    if (path == NULL)
	return(0);

#ifdef HAVE_STAT
#if defined(_WIN32)
    /*
     * On Windows stat and wstat do not work with long pathname,
     * which start with '\\?\'
     */
    if ((path[0] == '\\') && (path[1] == '\\') && (path[2] == '?') &&
	(path[3] == '\\') )
	    return 1;

    if (xmlWrapStatUtf8(path, &stat_buffer) == -1)
        return 0;
#else
    if (stat(path, &stat_buffer) == -1)
        return 0;
#endif
#ifdef S_ISDIR
    if (S_ISDIR(stat_buffer.st_mode))
        return 2;
#endif
#endif /* HAVE_STAT */
    return 1;
}